

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O1

QDomProcessingInstructionPrivate * __thiscall
QDomDocumentPrivate::createProcessingInstruction
          (QDomDocumentPrivate *this,QString *target,QString *data)

{
  QAtomicInt *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  int iVar5;
  long lVar6;
  QDomProcessingInstructionPrivate *this_00;
  char cVar7;
  long in_FS_OFFSET;
  QLatin1String QVar8;
  QString local_78;
  bool local_59;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_59 = true;
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if (QDomImplementationPrivate::invalidDataPolicy == AcceptInvalidChars) {
    local_59 = true;
    local_78.d.d = (data->d).d;
    local_78.d.ptr = (data->d).ptr;
    local_78.d.size = (data->d).size;
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    fixedCharData(&local_58,data,&local_59);
    if (local_59 == true) {
      cVar7 = local_59;
      do {
        QVar8.m_data = (char *)0x2;
        QVar8.m_size = (qsizetype)&local_58;
        lVar6 = QString::indexOf(QVar8,0x11f9ab,CaseInsensitive);
        if (lVar6 == -1) {
          iVar5 = 2;
        }
        else if (QDomImplementationPrivate::invalidDataPolicy == ReturnNullNode) {
          local_78.d.d = (Data *)0x0;
          local_78.d.ptr = (char16_t *)0x0;
          local_78.d.size = 0;
          iVar5 = 1;
          cVar7 = '\0';
        }
        else {
          QString::remove((longlong)&local_58,lVar6);
          iVar5 = 0;
        }
        qVar4 = local_58.d.size;
        pcVar3 = local_58.d.ptr;
        pDVar2 = local_58.d.d;
      } while (iVar5 == 0);
      local_59 = (bool)cVar7;
      if (iVar5 == 2) {
        local_59 = true;
        local_58.d.d = (Data *)0x0;
        local_58.d.ptr = (char16_t *)0x0;
        local_78.d.d = pDVar2;
        local_78.d.ptr = pcVar3;
        local_58.d.size = 0;
        local_78.d.size = qVar4;
      }
    }
    else {
      local_78.d.d = (Data *)0x0;
      local_78.d.ptr = (char16_t *)0x0;
      local_78.d.size = 0;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (local_59 == true) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QDomProcessingInstructionPrivate *)0x0;
    fixedXmlName(&local_58,target,&local_59,false);
    if (local_59 == true) {
      this_00 = (QDomProcessingInstructionPrivate *)operator_new(0xa8);
      QDomProcessingInstructionPrivate::QDomProcessingInstructionPrivate
                (this_00,this,(QDomNodePrivate *)0x0,&local_58,&local_78);
      LOCK();
      pQVar1 = &(this_00->super_QDomNodePrivate).ref;
      (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    this_00 = (QDomProcessingInstructionPrivate *)0x0;
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QDomProcessingInstructionPrivate* QDomDocumentPrivate::createProcessingInstruction(const QString &target,
                                                                                   const QString &data)
{
    bool ok;
    QString fixedData = fixedPIData(data, &ok);
    if (!ok)
        return nullptr;
    // [17] PITarget ::= Name - (('X' | 'x') ('M' | 'm') ('L' | 'l'))
    QString fixedTarget = fixedXmlName(target, &ok);
    if (!ok)
        return nullptr;

    QDomProcessingInstructionPrivate *p = new QDomProcessingInstructionPrivate(this, nullptr, fixedTarget, fixedData);
    p->ref.deref();
    return p;
}